

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

SequenceMatchListSyntax * __thiscall
slang::parsing::Parser::parseSequenceMatchList(Parser *this,Token *closeParen)

{
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  PropertyExprSyntax *pPVar4;
  undefined4 extraout_var;
  SequenceMatchListSyntax *pSVar6;
  Info *src;
  Info *extraout_RDX;
  size_t extraout_RDX_00;
  ulong uVar7;
  BumpAllocator *dst;
  TokenKind TVar8;
  Token TVar9;
  Token TVar10;
  Info *local_208;
  Token local_200;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1f0;
  undefined1 local_1e0;
  Token comma;
  SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> local_1c8 [7];
  pointer pTVar5;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
  if (!bVar1) {
    TVar9 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    *closeParen = TVar9;
    return (SequenceMatchListSyntax *)0x0;
  }
  Token::Token(&comma);
  comma = ParserBase::expect(&this->super_ParserBase,Comma);
  if ((comma._0_4_ >> 0x10 & 1) != 0) {
    SVar3 = Token::location(&comma);
    TVar9 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar3);
    *closeParen = TVar9;
    pTVar5 = (pointer)0x0;
    local_1c8[0].super_SyntaxListBase.childCount = 0;
    goto LAB_003d23df;
  }
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = Unknown;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode._4_4_ = 0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x10;
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  local_200 = TVar9;
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_200);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
LAB_003d2225:
    TVar9 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    src = TVar9.info;
    *closeParen = TVar9;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleArgument(TVar9.kind);
    if (bVar1) {
      while( true ) {
        local_208 = TVar9.info;
        pPVar4 = parsePropertyExpr(this,0);
        local_1f0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pPVar4;
        local_1e0 = 1;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f0._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
        if (TVar8 == EndOfFile || bVar1) break;
        if (TVar8 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleArgument,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x10001,false);
            if (!bVar1) goto LAB_003d2225;
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_1f0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1e0 = 0;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_1f0._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
        if (TVar8 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((local_208 == TVar10.info && TVar9.kind == TVar8) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleArgument,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
        uVar7 = TVar10._0_8_ & 0xffffffff;
        TVar9.info = TVar10.info;
        TVar9.kind = (short)uVar7;
        TVar9._2_1_ = (char)(uVar7 >> 0x10);
        TVar9.numFlags.raw = (char)(uVar7 >> 0x18);
        TVar9.rawLen = (int)(uVar7 >> 0x20);
        local_200 = TVar10;
      }
      goto LAB_003d2225;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar9,CloseParenthesis,closeParen,(DiagCode)0x10001);
    src = extraout_RDX;
  }
  dst = (this->super_ParserBase).alloc;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst,
                     (EVP_PKEY_CTX *)src);
  pTVar5 = (pointer)CONCAT44(extraout_var,iVar2);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,(EVP_PKEY_CTX *)dst);
  local_1c8[0].super_SyntaxListBase.childCount = extraout_RDX_00;
LAB_003d23df:
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_1c8[0].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0067a198;
  local_1c8[0].elements._M_ptr = pTVar5;
  local_1c8[0].elements._M_extent._M_extent_value = local_1c8[0].super_SyntaxListBase.childCount;
  pSVar6 = slang::syntax::SyntaxFactory::sequenceMatchList(&this->factory,comma,local_1c8);
  return pSVar6;
}

Assistant:

SequenceMatchListSyntax* Parser::parseSequenceMatchList(Token& closeParen) {
    if (!peek(TokenKind::Comma)) {
        closeParen = expect(TokenKind::CloseParenthesis);
        return nullptr;
    }

    Token comma;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleArgument, isEndOfParenList>(TokenKind::Comma, TokenKind::CloseParenthesis,
                                                    TokenKind::Comma, comma, list, closeParen,
                                                    RequireItems::True, diag::ExpectedExpression,
                                                    [this] { return &parsePropertyExpr(0); });

    return &factory.sequenceMatchList(comma, list);
}